

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O3

QString * __thiscall
QCborValueConstRef::concreteString
          (QString *__return_storage_ptr__,QCborValueConstRef *this,QCborValueConstRef self,
          QString *defaultValue)

{
  Data *pDVar1;
  long *plVar2;
  
  plVar2 = (long *)self.i;
  if ((int)(&(this[3].d)->usedData)[(long)self.d * 2] == 0x60) {
    QCborContainerPrivate::stringAt
              (__return_storage_ptr__,(QCborContainerPrivate *)this,(qsizetype)self.d);
  }
  else {
    pDVar1 = (Data *)*plVar2;
    (__return_storage_ptr__->d).d = pDVar1;
    (__return_storage_ptr__->d).ptr = (char16_t *)plVar2[1];
    (__return_storage_ptr__->d).size = plVar2[2];
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString QCborValueConstRef::concreteString(QCborValueConstRef self, const QString &defaultValue)
{
    QtCbor::Element e = self.d->elements.at(self.i);
    if (e.type != QCborValue::String)
        return defaultValue;
    return self.d->stringAt(self.i);
}